

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFAcceleratorTable.cpp
# Opt level: O2

void __thiscall llvm::AppleAcceleratorTable::dump(AppleAcceleratorTable *this,raw_ostream *OS)

{
  DWARFDataExtractor *this_00;
  ScopedPrinter *pSVar1;
  size_t *psVar2;
  StringRef N;
  StringRef N_00;
  StringRef N_01;
  undefined8 uVar3;
  bool bVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  raw_ostream *prVar7;
  ulong uVar8;
  ScopedPrinter *pSVar9;
  uint64_t uVar10;
  uint uVar11;
  uint uVar12;
  StringRef SVar13;
  StringRef Label;
  StringRef Value;
  StringRef Value_00;
  StringRef N_02;
  undefined1 local_1e0 [8];
  SmallVector<llvm::DWARFFormValue,_3U> AtomForms;
  ScopedPrinter W;
  Twine local_108;
  uint64_t local_f0;
  uint64_t HashOffset;
  uint64_t OffsetsOffset;
  undefined1 local_d8 [32];
  pointer local_b8;
  pointer pRStack_b0;
  ulong local_88;
  uint64_t DataOffset;
  ListScope HashScope;
  DelimitedScope<_[_,__]_> local_60;
  uint64_t Offset;
  undefined **local_50;
  DelimitedScope<___,____> local_48;
  DictScope AtomScope;
  ushort *local_38;
  
  if (this->IsValid == true) {
    pSVar1 = (ScopedPrinter *)
             (AtomForms.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.InlineElts[2].buffer +
             0x28);
    W.OS._0_4_ = 0;
    W.IndentLevel = 0;
    W._12_4_ = 0;
    W.Prefix.Data = (char *)0x0;
    AtomForms.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.InlineElts[2].buffer._40_8_ = OS;
    Header::dump(&this->Hdr,pSVar1);
    SVar13.Length = 0xf;
    SVar13.Data = "DIE offset base";
    ScopedPrinter::printNumber(pSVar1,SVar13,(this->HdrData).DIEOffsetBase);
    Label.Length = 0xf;
    Label.Data = "Number of atoms";
    ScopedPrinter::printNumber
              (pSVar1,Label,
               (ulong)(this->HdrData).Atoms.
                      super_SmallVectorImpl<std::pair<unsigned_short,_llvm::dwarf::Form>_>.
                      super_SmallVectorTemplateBase<std::pair<unsigned_short,_llvm::dwarf::Form>,_false>
                      .
                      super_SmallVectorTemplateCommon<std::pair<unsigned_short,_llvm::dwarf::Form>,_void>
                      .super_SmallVectorBase.Size);
    local_1e0 = (undefined1  [8])
                &AtomForms.super_SmallVectorImpl<llvm::DWARFFormValue>.
                 super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>.
                 super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.super_SmallVectorBase.
                 Size;
    AtomForms.super_SmallVectorImpl<llvm::DWARFFormValue>.
    super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>.
    super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.super_SmallVectorBase.BeginX =
         (void *)0x300000000;
    N_02.Length = 5;
    N_02.Data = "Atoms";
    DelimitedScope<'[',_']'>::DelimitedScope(&local_60,pSVar1,N_02);
    local_38 = (ushort *)
               (this->HdrData).Atoms.
               super_SmallVectorImpl<std::pair<unsigned_short,_llvm::dwarf::Form>_>.
               super_SmallVectorTemplateBase<std::pair<unsigned_short,_llvm::dwarf::Form>,_false>.
               super_SmallVectorTemplateCommon<std::pair<unsigned_short,_llvm::dwarf::Form>,_void>.
               super_SmallVectorBase.BeginX;
    uVar11 = 0;
    local_50 = &PTR_home_01127cd0;
    uVar10 = (ulong)(this->HdrData).Atoms.
                    super_SmallVectorImpl<std::pair<unsigned_short,_llvm::dwarf::Form>_>.
                    super_SmallVectorTemplateBase<std::pair<unsigned_short,_llvm::dwarf::Form>,_false>
                    .
                    super_SmallVectorTemplateCommon<std::pair<unsigned_short,_llvm::dwarf::Form>,_void>
                    .super_SmallVectorBase.Size << 2;
    while (uVar10 != 0) {
      Twine::Twine(&local_108,"Atom ");
      HashScope.W._4_4_ = 0;
      HashScope.W._0_4_ = uVar11;
      psVar2 = &W.Prefix.Length;
      Twine::concat((Twine *)psVar2,&local_108,(Twine *)&HashScope);
      Twine::str_abi_cxx11_((string *)local_d8,(Twine *)psVar2);
      AtomScope.W._0_4_ = uVar11;
      N.Data._2_6_ = local_d8._2_6_;
      N.Data._0_2_ = local_d8._0_2_;
      N.Length = local_d8._8_8_;
      pSVar1 = (ScopedPrinter *)
               (AtomForms.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.InlineElts[2].buffer +
               0x28);
      Offset = uVar10;
      DelimitedScope<'{',_'}'>::DelimitedScope(&local_48,pSVar1,N);
      std::__cxx11::string::~string((string *)local_d8);
      prVar7 = ScopedPrinter::startLine(pSVar1);
      prVar7 = raw_ostream::operator<<(prVar7,"Type: ");
      uVar3 = local_d8._16_8_;
      local_d8._18_2_ = 0;
      local_d8._16_2_ = *local_38;
      uVar11 = local_d8._16_4_;
      local_d8._16_8_ = uVar3;
      SVar13 = dwarf::AtomTypeString((uint)*local_38);
      if (SVar13.Length == 0) {
        prVar7 = raw_ostream::operator<<(prVar7,"DW_ATOM_unknown_");
        local_d8._8_8_ = "%x";
        local_d8._0_2_ = SUB82(local_50,0);
        local_d8._2_6_ = (undefined6)((ulong)local_50 >> 0x10);
        local_d8._16_8_ = CONCAT44(local_d8._20_4_,uVar11);
        prVar7 = raw_ostream::operator<<(prVar7,(format_object_base *)local_d8);
      }
      else {
        prVar7 = raw_ostream::operator<<(prVar7,SVar13);
      }
      raw_ostream::operator<<(prVar7,'\n');
      prVar7 = ScopedPrinter::startLine(pSVar1);
      prVar7 = raw_ostream::operator<<(prVar7,"Form: ");
      formatv<const_llvm::dwarf::Form_&>
                ((formatv_object<std::tuple<llvm::detail::provider_format_adapter<const_llvm::dwarf::Form_&>_>_>
                  *)local_d8,"{0}",local_38 + 1);
      prVar7 = raw_ostream::operator<<(prVar7,(formatv_object_base *)local_d8);
      raw_ostream::operator<<(prVar7,'\n');
      formatv_object_base::~formatv_object_base((formatv_object_base *)local_d8);
      local_d8._0_2_ = local_38[1];
      local_d8._8_8_ = (char *)0x0;
      local_d8._16_8_ = 0;
      local_b8 = (pointer)0x0;
      pRStack_b0 = (pointer)0x0;
      SmallVectorTemplateBase<llvm::DWARFFormValue,_true>::push_back
                ((SmallVectorTemplateBase<llvm::DWARFFormValue,_true> *)local_1e0,
                 (DWARFFormValue *)local_d8);
      DelimitedScope<'{',_'}'>::~DelimitedScope(&local_48);
      local_38 = local_38 + 2;
      uVar11 = (uint)AtomScope.W + 1;
      uVar10 = Offset - 4;
    }
    DelimitedScope<'[',_']'>::~DelimitedScope(&local_60);
    uVar8 = (ulong)(this->Hdr).HeaderDataLength;
    local_60.W = (ScopedPrinter *)(uVar8 + 0x14);
    uVar11 = (this->Hdr).BucketCount;
    local_50 = (undefined **)(uVar8 + uVar11 * 4 + 0x14);
    Offset = (ulong)((this->Hdr).HashCount << 2) + (long)local_50;
    this_00 = &(this->super_DWARFAcceleratorTable).AccelSection;
    pSVar1 = (ScopedPrinter *)
             (AtomForms.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.InlineElts[2].buffer +
             0x28);
    for (uVar12 = 0; uVar12 < uVar11; uVar12 = uVar12 + 1) {
      uVar5 = DataExtractor::getU32
                        (&this_00->super_DataExtractor,(uint64_t *)&local_60,(Error *)0x0);
      AtomScope.W._0_4_ = uVar5;
      Twine::Twine(&local_108,"Bucket ");
      HashScope.W._4_4_ = 0;
      HashScope.W._0_4_ = uVar12;
      psVar2 = &W.Prefix.Length;
      Twine::concat((Twine *)psVar2,&local_108,(Twine *)&HashScope);
      Twine::str_abi_cxx11_((string *)local_d8,(Twine *)psVar2);
      N_00.Data._2_6_ = local_d8._2_6_;
      N_00.Data._0_2_ = local_d8._0_2_;
      N_00.Length = local_d8._8_8_;
      DelimitedScope<'[',_']'>::DelimitedScope((DelimitedScope<_[_,__]_> *)&local_48,pSVar1,N_00);
      std::__cxx11::string::~string((string *)local_d8);
      if ((uint)AtomScope.W == -1) {
        Value_00.Length = 5;
        Value_00.Data = "EMPTY";
        ScopedPrinter::printString(pSVar1,Value_00);
      }
      else {
        pSVar9 = AtomScope.W & 0xffffffff;
        while (pSVar9 < (ScopedPrinter *)(ulong)(this->Hdr).HashCount) {
          uVar8 = (ulong)(uint)((int)pSVar9 * 4);
          local_f0 = (long)local_50 + uVar8;
          HashOffset = uVar8 + Offset;
          AtomScope.W = pSVar9;
          uVar5 = DataExtractor::getU32(&this_00->super_DataExtractor,&local_f0,(Error *)0x0);
          if (uVar5 % (this->Hdr).BucketCount != uVar12) break;
          uVar6 = DataExtractor::getU32(&this_00->super_DataExtractor,&HashOffset,(Error *)0x0);
          local_88 = (ulong)uVar6;
          Twine::Twine(&local_108,"Hash 0x");
          OffsetsOffset = (uint64_t)uVar5;
          Twine::utohexstr((Twine *)&HashScope,&OffsetsOffset);
          psVar2 = &W.Prefix.Length;
          Twine::concat((Twine *)psVar2,&local_108,(Twine *)&HashScope);
          Twine::str_abi_cxx11_((string *)local_d8,(Twine *)psVar2);
          N_01.Data._2_6_ = local_d8._2_6_;
          N_01.Data._0_2_ = local_d8._0_2_;
          N_01.Length = local_d8._8_8_;
          DelimitedScope<'[',_']'>::DelimitedScope
                    ((DelimitedScope<_[_,__]_> *)&DataOffset,pSVar1,N_01);
          std::__cxx11::string::~string((string *)local_d8);
          if (local_88 <
              (this->super_DWARFAcceleratorTable).AccelSection.super_DataExtractor.Data.Length) {
            do {
              bVar4 = dumpName(this,pSVar1,(SmallVectorImpl<llvm::DWARFFormValue> *)local_1e0,
                               &local_88);
            } while (bVar4);
          }
          else {
            Value.Length = 0x16;
            Value.Data = "Invalid section offset";
            ScopedPrinter::printString(pSVar1,Value);
          }
          DelimitedScope<'[',_']'>::~DelimitedScope((DelimitedScope<_[_,__]_> *)&DataOffset);
          pSVar9 = (ScopedPrinter *)((long)&(AtomScope.W)->OS + 1);
        }
      }
      DelimitedScope<'[',_']'>::~DelimitedScope((DelimitedScope<_[_,__]_> *)&local_48);
      uVar11 = (this->Hdr).BucketCount;
    }
    SmallVectorImpl<llvm::DWARFFormValue>::~SmallVectorImpl
              ((SmallVectorImpl<llvm::DWARFFormValue> *)local_1e0);
  }
  return;
}

Assistant:

LLVM_DUMP_METHOD void AppleAcceleratorTable::dump(raw_ostream &OS) const {
  if (!IsValid)
    return;

  ScopedPrinter W(OS);

  Hdr.dump(W);

  W.printNumber("DIE offset base", HdrData.DIEOffsetBase);
  W.printNumber("Number of atoms", uint64_t(HdrData.Atoms.size()));
  SmallVector<DWARFFormValue, 3> AtomForms;
  {
    ListScope AtomsScope(W, "Atoms");
    unsigned i = 0;
    for (const auto &Atom : HdrData.Atoms) {
      DictScope AtomScope(W, ("Atom " + Twine(i++)).str());
      W.startLine() << "Type: " << formatAtom(Atom.first) << '\n';
      W.startLine() << "Form: " << formatv("{0}", Atom.second) << '\n';
      AtomForms.push_back(DWARFFormValue(Atom.second));
    }
  }

  // Now go through the actual tables and dump them.
  uint64_t Offset = sizeof(Hdr) + Hdr.HeaderDataLength;
  uint64_t HashesBase = Offset + Hdr.BucketCount * 4;
  uint64_t OffsetsBase = HashesBase + Hdr.HashCount * 4;

  for (unsigned Bucket = 0; Bucket < Hdr.BucketCount; ++Bucket) {
    unsigned Index = AccelSection.getU32(&Offset);

    ListScope BucketScope(W, ("Bucket " + Twine(Bucket)).str());
    if (Index == UINT32_MAX) {
      W.printString("EMPTY");
      continue;
    }

    for (unsigned HashIdx = Index; HashIdx < Hdr.HashCount; ++HashIdx) {
      uint64_t HashOffset = HashesBase + HashIdx*4;
      uint64_t OffsetsOffset = OffsetsBase + HashIdx*4;
      uint32_t Hash = AccelSection.getU32(&HashOffset);

      if (Hash % Hdr.BucketCount != Bucket)
        break;

      uint64_t DataOffset = AccelSection.getU32(&OffsetsOffset);
      ListScope HashScope(W, ("Hash 0x" + Twine::utohexstr(Hash)).str());
      if (!AccelSection.isValidOffset(DataOffset)) {
        W.printString("Invalid section offset");
        continue;
      }
      while (dumpName(W, AtomForms, &DataOffset))
        /*empty*/;
    }
  }
}